

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::ResetCache(DFA *this,RWLocker *cache_lock)

{
  atomic<int> *paVar1;
  ostream *poVar2;
  size_type sVar3;
  int local_1c8;
  int i;
  LogMessage local_1b8;
  byte local_31;
  RWLocker *pRStack_30;
  bool was_writing;
  RWLocker *cache_lock_local;
  DFA *this_local;
  int local_18;
  memory_order __b;
  atomic<int> *local_10;
  
  pRStack_30 = cache_lock;
  cache_lock_local = (RWLocker *)this;
  local_31 = RWLocker::IsLockedForWriting(cache_lock);
  RWLocker::LockForWriting(pRStack_30);
  if (((local_31 & 1) != 0) && ((this->cache_warned_ & 1U) == 0)) {
    LogMessage::LogMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x486,0
              );
    poVar2 = LogMessage::stream(&local_1b8);
    poVar2 = std::operator<<(poVar2,"DFA memory cache could be too small: ");
    poVar2 = std::operator<<(poVar2,"only room for ");
    sVar3 = std::
            unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
            ::size(&this->state_cache_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2," states.");
    LogMessage::~LogMessage(&local_1b8);
    this->cache_warned_ = true;
  }
  for (local_1c8 = 0; local_1c8 < 8; local_1c8 = local_1c8 + 1) {
    this->start_[local_1c8].start = (State *)0x0;
    paVar1 = &this->start_[local_1c8].firstbyte;
    __b = ~memory_order_relaxed;
    local_18 = 0;
    local_10 = paVar1;
    this_local._4_4_ = std::operator&(memory_order_relaxed,__memory_order_mask);
    this_local._0_4_ = __b;
    if (local_18 == 3) {
      (paVar1->super___atomic_base<int>)._M_i = __b;
    }
    else if (local_18 == 5) {
      LOCK();
      (paVar1->super___atomic_base<int>)._M_i = __b;
      UNLOCK();
    }
    else {
      (paVar1->super___atomic_base<int>)._M_i = __b;
    }
  }
  ClearCache(this);
  this->mem_budget_ = this->state_budget_;
  return;
}

Assistant:

void DFA::ResetCache(RWLocker* cache_lock) {
  // Re-acquire the cache_mutex_ for writing (exclusive use).
  bool was_writing = cache_lock->IsLockedForWriting();
  cache_lock->LockForWriting();

  // If we already held cache_mutex_ for writing, it means
  // this invocation of Search() has already reset the
  // cache once already.  That's a pretty clear indication
  // that the cache is too small.  Warn about that, once.
  // TODO(rsc): Only warn if state_cache_.size() < some threshold.
  if (was_writing && !cache_warned_) {
    LOG(INFO) << "DFA memory cache could be too small: "
              << "only room for " << state_cache_.size() << " states.";
    cache_warned_ = true;
  }

  // Clear the cache, reset the memory budget.
  for (int i = 0; i < kMaxStart; i++) {
    start_[i].start = NULL;
    start_[i].firstbyte.store(kFbUnknown, std::memory_order_relaxed);
  }
  ClearCache();
  mem_budget_ = state_budget_;
}